

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O3

void aom_hadamard_32x32_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  short *psVar4;
  short *psVar5;
  short *psVar6;
  short *psVar7;
  short *psVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  uint uVar13;
  undefined1 *puVar14;
  long lVar15;
  long lVar16;
  short *psVar17;
  short sVar18;
  int iVar19;
  undefined4 uVar20;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  undefined1 auVar24 [16];
  short sVar35;
  int iVar36;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  short sVar50;
  undefined4 uVar51;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  short sVar71;
  short sVar84;
  int iVar72;
  undefined1 auVar74 [12];
  short sVar85;
  short sVar87;
  int iVar86;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  short sVar92;
  int iVar93;
  undefined1 auVar95 [12];
  short sVar100;
  short sVar101;
  int iVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  short sVar108;
  short sVar114;
  int iVar109;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  short sVar121;
  short sVar131;
  int iVar122;
  short sVar132;
  short sVar133;
  short sVar134;
  short sVar135;
  short sVar136;
  short sVar137;
  undefined1 auVar125 [16];
  short sVar138;
  short sVar150;
  int iVar139;
  short sVar151;
  short sVar153;
  int iVar152;
  short sVar154;
  short sVar155;
  short sVar156;
  short sVar157;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  short sVar158;
  short sVar163;
  int iVar159;
  short sVar164;
  short sVar165;
  short sVar166;
  short sVar167;
  short sVar168;
  short sVar169;
  short sVar170;
  int iVar172;
  short sVar173;
  short sVar174;
  short sVar175;
  undefined1 auVar171 [16];
  short sVar176;
  short sVar177;
  short sVar178;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar184;
  short sVar185;
  short sVar186;
  short sVar187;
  short sVar188;
  short sVar189;
  short sVar190;
  short sVar191;
  short sVar192;
  short sVar193;
  short sVar194;
  short sVar195;
  short sVar196;
  int16_t temp_coeff_1 [256];
  int16_t temp_coeff [1024];
  short local_a40 [56];
  short local_9d0 [8];
  short asStack_9c0 [64];
  short asStack_940 [64];
  short asStack_8c0 [64];
  undefined1 local_840 [512];
  undefined1 auStack_640 [512];
  undefined1 auStack_440 [512];
  undefined1 auStack_240 [544];
  undefined6 uVar21;
  undefined1 auVar25 [16];
  undefined8 uVar22;
  undefined1 auVar26 [16];
  undefined1 auVar23 [12];
  undefined1 auVar27 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar59 [16];
  undefined6 uVar52;
  undefined1 auVar60 [16];
  undefined8 uVar53;
  undefined1 auVar61 [16];
  undefined1 auVar54 [12];
  undefined1 auVar62 [16];
  undefined1 auVar57 [16];
  undefined1 auVar63 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar73 [12];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar83 [16];
  undefined1 auVar94 [12];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar110 [12];
  undefined1 auVar111 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar123 [12];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar124 [16];
  undefined1 auVar130 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar140 [16];
  undefined1 auVar147 [16];
  undefined1 auVar141 [16];
  undefined1 auVar148 [16];
  undefined1 auVar142 [16];
  undefined1 auVar149 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  
  puVar14 = local_840;
  lVar16 = 0;
  do {
    uVar13 = 0;
    lVar15 = 0;
    psVar17 = local_9d0;
    do {
      psVar1 = (short *)((long)src_diff +
                        (ulong)(uVar13 & 8) * 2 +
                        (ulong)((uint)lVar15 & 8) * src_stride * 2 +
                        (ulong)(((uint)lVar16 & 1) << 5) +
                        (ulong)((uint)lVar16 * 8 & 0x10) * src_stride * 2);
      psVar2 = psVar1 + src_stride;
      psVar3 = psVar2 + src_stride;
      psVar4 = psVar3 + src_stride;
      psVar5 = psVar4 + src_stride;
      psVar6 = psVar5 + src_stride;
      psVar7 = psVar6 + src_stride;
      psVar8 = psVar7 + src_stride;
      sVar121 = *psVar2 + *psVar1;
      sVar131 = psVar2[1] + psVar1[1];
      sVar132 = psVar2[2] + psVar1[2];
      sVar133 = psVar2[3] + psVar1[3];
      sVar134 = psVar2[4] + psVar1[4];
      sVar135 = psVar2[5] + psVar1[5];
      sVar136 = psVar2[6] + psVar1[6];
      sVar137 = psVar2[7] + psVar1[7];
      sVar35 = *psVar1 - *psVar2;
      sVar43 = psVar1[1] - psVar2[1];
      sVar44 = psVar1[2] - psVar2[2];
      sVar45 = psVar1[3] - psVar2[3];
      sVar46 = psVar1[4] - psVar2[4];
      sVar47 = psVar1[5] - psVar2[5];
      sVar48 = psVar1[6] - psVar2[6];
      sVar49 = psVar1[7] - psVar2[7];
      sVar176 = *psVar4 + *psVar3;
      sVar178 = psVar4[1] + psVar3[1];
      sVar180 = psVar4[2] + psVar3[2];
      sVar182 = psVar4[3] + psVar3[3];
      sVar184 = psVar4[4] + psVar3[4];
      sVar186 = psVar4[5] + psVar3[5];
      sVar188 = psVar4[6] + psVar3[6];
      sVar190 = psVar4[7] + psVar3[7];
      sVar18 = *psVar3 - *psVar4;
      sVar28 = psVar3[1] - psVar4[1];
      sVar29 = psVar3[2] - psVar4[2];
      sVar30 = psVar3[3] - psVar4[3];
      sVar31 = psVar3[4] - psVar4[4];
      sVar32 = psVar3[5] - psVar4[5];
      sVar33 = psVar3[6] - psVar4[6];
      sVar34 = psVar3[7] - psVar4[7];
      sVar138 = *psVar6 + *psVar5;
      sVar150 = psVar6[1] + psVar5[1];
      sVar151 = psVar6[2] + psVar5[2];
      sVar153 = psVar6[3] + psVar5[3];
      sVar154 = psVar6[4] + psVar5[4];
      sVar155 = psVar6[5] + psVar5[5];
      sVar156 = psVar6[6] + psVar5[6];
      sVar157 = psVar6[7] + psVar5[7];
      sVar108 = *psVar5 - *psVar6;
      sVar114 = psVar5[1] - psVar6[1];
      sVar115 = psVar5[2] - psVar6[2];
      sVar116 = psVar5[3] - psVar6[3];
      sVar117 = psVar5[4] - psVar6[4];
      sVar118 = psVar5[5] - psVar6[5];
      sVar119 = psVar5[6] - psVar6[6];
      sVar120 = psVar5[7] - psVar6[7];
      sVar158 = *psVar8 + *psVar7;
      sVar163 = psVar8[1] + psVar7[1];
      sVar164 = psVar8[2] + psVar7[2];
      sVar165 = psVar8[3] + psVar7[3];
      sVar166 = psVar8[4] + psVar7[4];
      sVar167 = psVar8[5] + psVar7[5];
      sVar168 = psVar8[6] + psVar7[6];
      sVar169 = psVar8[7] + psVar7[7];
      sVar92 = *psVar7 - *psVar8;
      sVar100 = psVar7[1] - psVar8[1];
      sVar101 = psVar7[2] - psVar8[2];
      sVar103 = psVar7[3] - psVar8[3];
      sVar104 = psVar7[4] - psVar8[4];
      sVar105 = psVar7[5] - psVar8[5];
      sVar106 = psVar7[6] - psVar8[6];
      sVar107 = psVar7[7] - psVar8[7];
      sVar50 = sVar176 + sVar121;
      sVar64 = sVar178 + sVar131;
      sVar65 = sVar180 + sVar132;
      sVar66 = sVar182 + sVar133;
      sVar67 = sVar184 + sVar134;
      sVar68 = sVar186 + sVar135;
      sVar69 = sVar188 + sVar136;
      sVar70 = sVar190 + sVar137;
      sVar71 = sVar18 + sVar35;
      sVar84 = sVar28 + sVar43;
      sVar85 = sVar29 + sVar44;
      sVar87 = sVar30 + sVar45;
      sVar88 = sVar31 + sVar46;
      sVar89 = sVar32 + sVar47;
      sVar90 = sVar33 + sVar48;
      sVar91 = sVar34 + sVar49;
      sVar121 = sVar121 - sVar176;
      sVar131 = sVar131 - sVar178;
      sVar132 = sVar132 - sVar180;
      sVar133 = sVar133 - sVar182;
      sVar134 = sVar134 - sVar184;
      sVar135 = sVar135 - sVar186;
      sVar136 = sVar136 - sVar188;
      sVar137 = sVar137 - sVar190;
      sVar35 = sVar35 - sVar18;
      sVar43 = sVar43 - sVar28;
      sVar44 = sVar44 - sVar29;
      sVar45 = sVar45 - sVar30;
      sVar46 = sVar46 - sVar31;
      sVar47 = sVar47 - sVar32;
      sVar48 = sVar48 - sVar33;
      sVar49 = sVar49 - sVar34;
      sVar176 = sVar158 + sVar138;
      sVar178 = sVar163 + sVar150;
      sVar180 = sVar164 + sVar151;
      sVar182 = sVar165 + sVar153;
      sVar184 = sVar166 + sVar154;
      sVar173 = sVar167 + sVar155;
      sVar174 = sVar168 + sVar156;
      sVar175 = sVar169 + sVar157;
      sVar177 = sVar92 + sVar108;
      sVar179 = sVar100 + sVar114;
      sVar181 = sVar101 + sVar115;
      sVar183 = sVar103 + sVar116;
      sVar185 = sVar104 + sVar117;
      sVar187 = sVar105 + sVar118;
      sVar189 = sVar106 + sVar119;
      sVar191 = sVar107 + sVar120;
      sVar138 = sVar138 - sVar158;
      sVar150 = sVar150 - sVar163;
      sVar151 = sVar151 - sVar164;
      sVar153 = sVar153 - sVar165;
      sVar154 = sVar154 - sVar166;
      sVar155 = sVar155 - sVar167;
      sVar156 = sVar156 - sVar168;
      sVar157 = sVar157 - sVar169;
      sVar108 = sVar108 - sVar92;
      sVar114 = sVar114 - sVar100;
      sVar115 = sVar115 - sVar101;
      sVar116 = sVar116 - sVar103;
      sVar117 = sVar117 - sVar104;
      sVar118 = sVar118 - sVar105;
      sVar119 = sVar119 - sVar106;
      sVar120 = sVar120 - sVar107;
      sVar18 = sVar176 + sVar50;
      sVar28 = sVar178 + sVar64;
      sVar30 = sVar180 + sVar65;
      sVar29 = sVar182 + sVar66;
      sVar33 = sVar184 + sVar67;
      sVar31 = sVar173 + sVar68;
      sVar92 = sVar174 + sVar69;
      sVar32 = sVar175 + sVar70;
      sVar103 = sVar177 + sVar71;
      sVar167 = sVar179 + sVar84;
      sVar186 = sVar181 + sVar85;
      sVar168 = sVar183 + sVar87;
      sVar106 = sVar185 + sVar88;
      sVar169 = sVar187 + sVar89;
      sVar190 = sVar189 + sVar90;
      sVar170 = sVar191 + sVar91;
      sVar100 = sVar138 + sVar121;
      sVar192 = sVar150 + sVar131;
      sVar188 = sVar151 + sVar132;
      sVar193 = sVar153 + sVar133;
      sVar104 = sVar154 + sVar134;
      sVar194 = sVar155 + sVar135;
      sVar195 = sVar156 + sVar136;
      sVar196 = sVar157 + sVar137;
      sVar101 = sVar108 + sVar35;
      sVar34 = sVar114 + sVar43;
      sVar158 = sVar115 + sVar44;
      sVar163 = sVar116 + sVar45;
      sVar105 = sVar117 + sVar46;
      sVar164 = sVar118 + sVar47;
      sVar165 = sVar119 + sVar48;
      sVar166 = sVar120 + sVar49;
      sVar50 = sVar50 - sVar176;
      sVar64 = sVar64 - sVar178;
      sVar65 = sVar65 - sVar180;
      sVar66 = sVar66 - sVar182;
      sVar67 = sVar67 - sVar184;
      sVar68 = sVar68 - sVar173;
      sVar69 = sVar69 - sVar174;
      sVar70 = sVar70 - sVar175;
      sVar71 = sVar71 - sVar177;
      sVar84 = sVar84 - sVar179;
      sVar85 = sVar85 - sVar181;
      sVar87 = sVar87 - sVar183;
      sVar88 = sVar88 - sVar185;
      sVar89 = sVar89 - sVar187;
      sVar90 = sVar90 - sVar189;
      sVar91 = sVar91 - sVar191;
      sVar121 = sVar121 - sVar138;
      sVar131 = sVar131 - sVar150;
      sVar132 = sVar132 - sVar151;
      sVar133 = sVar133 - sVar153;
      sVar134 = sVar134 - sVar154;
      sVar135 = sVar135 - sVar155;
      sVar136 = sVar136 - sVar156;
      sVar137 = sVar137 - sVar157;
      sVar35 = sVar35 - sVar108;
      sVar43 = sVar43 - sVar114;
      sVar44 = sVar44 - sVar115;
      sVar45 = sVar45 - sVar116;
      sVar46 = sVar46 - sVar117;
      sVar47 = sVar47 - sVar118;
      sVar48 = sVar48 - sVar119;
      sVar49 = sVar49 - sVar120;
      sVar107 = sVar28 + sVar18;
      sVar108 = sVar131 + sVar121;
      sVar114 = sVar64 + sVar50;
      sVar115 = sVar192 + sVar100;
      sVar116 = sVar34 + sVar101;
      sVar117 = sVar43 + sVar35;
      sVar118 = sVar84 + sVar71;
      sVar119 = sVar167 + sVar103;
      sVar18 = sVar18 - sVar28;
      sVar121 = sVar121 - sVar131;
      sVar50 = sVar50 - sVar64;
      sVar100 = sVar100 - sVar192;
      sVar101 = sVar101 - sVar34;
      sVar35 = sVar35 - sVar43;
      sVar71 = sVar71 - sVar84;
      sVar103 = sVar103 - sVar167;
      sVar138 = sVar29 + sVar30;
      sVar150 = sVar133 + sVar132;
      sVar151 = sVar66 + sVar65;
      sVar153 = sVar193 + sVar188;
      sVar154 = sVar163 + sVar158;
      sVar155 = sVar45 + sVar44;
      sVar156 = sVar87 + sVar85;
      sVar157 = sVar168 + sVar186;
      sVar30 = sVar30 - sVar29;
      sVar132 = sVar132 - sVar133;
      sVar65 = sVar65 - sVar66;
      sVar188 = sVar188 - sVar193;
      sVar158 = sVar158 - sVar163;
      sVar44 = sVar44 - sVar45;
      sVar85 = sVar85 - sVar87;
      sVar186 = sVar186 - sVar168;
      sVar64 = sVar31 + sVar33;
      sVar66 = sVar135 + sVar134;
      sVar84 = sVar68 + sVar67;
      sVar87 = sVar194 + sVar104;
      sVar163 = sVar164 + sVar105;
      sVar120 = sVar47 + sVar46;
      sVar131 = sVar89 + sVar88;
      sVar133 = sVar169 + sVar106;
      sVar33 = sVar33 - sVar31;
      sVar134 = sVar134 - sVar135;
      sVar67 = sVar67 - sVar68;
      sVar104 = sVar104 - sVar194;
      sVar105 = sVar105 - sVar164;
      sVar46 = sVar46 - sVar47;
      sVar88 = sVar88 - sVar89;
      sVar106 = sVar106 - sVar169;
      sVar167 = sVar32 + sVar92;
      sVar168 = sVar137 + sVar136;
      sVar169 = sVar70 + sVar69;
      sVar176 = sVar196 + sVar195;
      sVar178 = sVar166 + sVar165;
      sVar180 = sVar49 + sVar48;
      sVar182 = sVar91 + sVar90;
      sVar184 = sVar170 + sVar190;
      sVar92 = sVar92 - sVar32;
      sVar136 = sVar136 - sVar137;
      sVar69 = sVar69 - sVar70;
      sVar195 = sVar195 - sVar196;
      sVar165 = sVar165 - sVar166;
      sVar48 = sVar48 - sVar49;
      sVar90 = sVar90 - sVar91;
      sVar190 = sVar190 - sVar170;
      sVar49 = sVar138 + sVar107;
      sVar68 = sVar150 + sVar108;
      sVar70 = sVar151 + sVar114;
      sVar89 = sVar153 + sVar115;
      sVar91 = sVar154 + sVar116;
      sVar164 = sVar155 + sVar117;
      sVar166 = sVar156 + sVar118;
      sVar135 = sVar157 + sVar119;
      sVar28 = sVar30 + sVar18;
      sVar29 = sVar132 + sVar121;
      sVar31 = sVar65 + sVar50;
      sVar32 = sVar188 + sVar100;
      sVar34 = sVar158 + sVar101;
      sVar43 = sVar44 + sVar35;
      sVar45 = sVar85 + sVar71;
      sVar47 = sVar186 + sVar103;
      sVar107 = sVar107 - sVar138;
      sVar108 = sVar108 - sVar150;
      sVar114 = sVar114 - sVar151;
      sVar115 = sVar115 - sVar153;
      sVar116 = sVar116 - sVar154;
      sVar117 = sVar117 - sVar155;
      sVar118 = sVar118 - sVar156;
      sVar119 = sVar119 - sVar157;
      sVar18 = sVar18 - sVar30;
      sVar121 = sVar121 - sVar132;
      sVar50 = sVar50 - sVar65;
      sVar100 = sVar100 - sVar188;
      sVar101 = sVar101 - sVar158;
      sVar35 = sVar35 - sVar44;
      sVar71 = sVar71 - sVar85;
      sVar103 = sVar103 - sVar186;
      sVar30 = sVar167 + sVar64;
      sVar44 = sVar168 + sVar66;
      sVar65 = sVar169 + sVar84;
      sVar85 = sVar176 + sVar87;
      sVar158 = sVar178 + sVar163;
      sVar138 = sVar180 + sVar120;
      sVar150 = sVar182 + sVar131;
      sVar132 = sVar184 + sVar133;
      sVar151 = sVar92 + sVar33;
      sVar153 = sVar136 + sVar134;
      sVar154 = sVar69 + sVar67;
      sVar155 = sVar195 + sVar104;
      sVar156 = sVar165 + sVar105;
      sVar137 = sVar48 + sVar46;
      sVar157 = sVar90 + sVar88;
      sVar186 = sVar190 + sVar106;
      sVar64 = sVar64 - sVar167;
      sVar66 = sVar66 - sVar168;
      sVar84 = sVar84 - sVar169;
      sVar87 = sVar87 - sVar176;
      sVar163 = sVar163 - sVar178;
      sVar120 = sVar120 - sVar180;
      sVar131 = sVar131 - sVar182;
      sVar133 = sVar133 - sVar184;
      sVar33 = sVar33 - sVar92;
      sVar134 = sVar134 - sVar136;
      sVar67 = sVar67 - sVar69;
      sVar104 = sVar104 - sVar195;
      sVar105 = sVar105 - sVar165;
      sVar46 = sVar46 - sVar48;
      sVar88 = sVar88 - sVar90;
      sVar106 = sVar106 - sVar190;
      psVar17[-0x38] = sVar30 + sVar49;
      psVar17[-0x37] = sVar44 + sVar68;
      psVar17[-0x36] = sVar65 + sVar70;
      psVar17[-0x35] = sVar85 + sVar89;
      psVar17[-0x34] = sVar158 + sVar91;
      psVar17[-0x33] = sVar138 + sVar164;
      psVar17[-0x32] = sVar150 + sVar166;
      psVar17[-0x31] = sVar132 + sVar135;
      psVar17[-0x30] = sVar107 - sVar64;
      psVar17[-0x2f] = sVar108 - sVar66;
      psVar17[-0x2e] = sVar114 - sVar84;
      psVar17[-0x2d] = sVar115 - sVar87;
      psVar17[-0x2c] = sVar116 - sVar163;
      psVar17[-0x2b] = sVar117 - sVar120;
      psVar17[-0x2a] = sVar118 - sVar131;
      psVar17[-0x29] = sVar119 - sVar133;
      psVar17[-0x28] = sVar49 - sVar30;
      psVar17[-0x27] = sVar68 - sVar44;
      psVar17[-0x26] = sVar70 - sVar65;
      psVar17[-0x25] = sVar89 - sVar85;
      psVar17[-0x24] = sVar91 - sVar158;
      psVar17[-0x23] = sVar164 - sVar138;
      psVar17[-0x22] = sVar166 - sVar150;
      psVar17[-0x21] = sVar135 - sVar132;
      psVar17[-0x20] = sVar64 + sVar107;
      psVar17[-0x1f] = sVar66 + sVar108;
      psVar17[-0x1e] = sVar84 + sVar114;
      psVar17[-0x1d] = sVar87 + sVar115;
      psVar17[-0x1c] = sVar163 + sVar116;
      psVar17[-0x1b] = sVar120 + sVar117;
      psVar17[-0x1a] = sVar131 + sVar118;
      psVar17[-0x19] = sVar133 + sVar119;
      psVar17[-0x18] = sVar33 + sVar18;
      psVar17[-0x17] = sVar134 + sVar121;
      psVar17[-0x16] = sVar67 + sVar50;
      psVar17[-0x15] = sVar104 + sVar100;
      psVar17[-0x14] = sVar105 + sVar101;
      psVar17[-0x13] = sVar46 + sVar35;
      psVar17[-0x12] = sVar88 + sVar71;
      psVar17[-0x11] = sVar106 + sVar103;
      psVar17[-0x10] = sVar18 - sVar33;
      psVar17[-0xf] = sVar121 - sVar134;
      psVar17[-0xe] = sVar50 - sVar67;
      psVar17[-0xd] = sVar100 - sVar104;
      psVar17[-0xc] = sVar101 - sVar105;
      psVar17[-0xb] = sVar35 - sVar46;
      psVar17[-10] = sVar71 - sVar88;
      psVar17[-9] = sVar103 - sVar106;
      psVar17[-8] = sVar28 - sVar151;
      psVar17[-7] = sVar29 - sVar153;
      psVar17[-6] = sVar31 - sVar154;
      psVar17[-5] = sVar32 - sVar155;
      psVar17[-4] = sVar34 - sVar156;
      psVar17[-3] = sVar43 - sVar137;
      psVar17[-2] = sVar45 - sVar157;
      psVar17[-1] = sVar47 - sVar186;
      *psVar17 = sVar151 + sVar28;
      psVar17[1] = sVar153 + sVar29;
      psVar17[2] = sVar154 + sVar31;
      psVar17[3] = sVar155 + sVar32;
      psVar17[4] = sVar156 + sVar34;
      psVar17[5] = sVar137 + sVar43;
      psVar17[6] = sVar157 + sVar45;
      psVar17[7] = sVar186 + sVar47;
      lVar15 = lVar15 + 4;
      psVar17 = psVar17 + 0x40;
      uVar13 = uVar13 + 8;
    } while (lVar15 != 0x10);
    lVar15 = 0;
    do {
      auVar96._0_2_ = asStack_9c0[lVar15] + local_a40[lVar15];
      auVar96._2_2_ = asStack_9c0[lVar15 + 1] + local_a40[lVar15 + 1];
      auVar96._4_2_ = asStack_9c0[lVar15 + 2] + local_a40[lVar15 + 2];
      auVar96._6_2_ = asStack_9c0[lVar15 + 3] + local_a40[lVar15 + 3];
      auVar96._8_2_ = asStack_9c0[lVar15 + 4] + local_a40[lVar15 + 4];
      auVar96._10_2_ = asStack_9c0[lVar15 + 5] + local_a40[lVar15 + 5];
      auVar96._12_2_ = asStack_9c0[lVar15 + 6] + local_a40[lVar15 + 6];
      auVar96._14_2_ = asStack_9c0[lVar15 + 7] + local_a40[lVar15 + 7];
      auVar24._0_2_ = local_a40[lVar15] - asStack_9c0[lVar15];
      auVar24._2_2_ = local_a40[lVar15 + 1] - asStack_9c0[lVar15 + 1];
      auVar24._4_2_ = local_a40[lVar15 + 2] - asStack_9c0[lVar15 + 2];
      auVar24._6_2_ = local_a40[lVar15 + 3] - asStack_9c0[lVar15 + 3];
      auVar24._8_2_ = local_a40[lVar15 + 4] - asStack_9c0[lVar15 + 4];
      auVar24._10_2_ = local_a40[lVar15 + 5] - asStack_9c0[lVar15 + 5];
      auVar24._12_2_ = local_a40[lVar15 + 6] - asStack_9c0[lVar15 + 6];
      auVar24._14_2_ = local_a40[lVar15 + 7] - asStack_9c0[lVar15 + 7];
      auVar37._0_2_ = asStack_8c0[lVar15] + asStack_940[lVar15];
      auVar37._2_2_ = asStack_8c0[lVar15 + 1] + asStack_940[lVar15 + 1];
      auVar37._4_2_ = asStack_8c0[lVar15 + 2] + asStack_940[lVar15 + 2];
      auVar37._6_2_ = asStack_8c0[lVar15 + 3] + asStack_940[lVar15 + 3];
      auVar37._8_2_ = asStack_8c0[lVar15 + 4] + asStack_940[lVar15 + 4];
      auVar37._10_2_ = asStack_8c0[lVar15 + 5] + asStack_940[lVar15 + 5];
      auVar37._12_2_ = asStack_8c0[lVar15 + 6] + asStack_940[lVar15 + 6];
      auVar37._14_2_ = asStack_8c0[lVar15 + 7] + asStack_940[lVar15 + 7];
      auVar55._0_2_ = asStack_940[lVar15] - asStack_8c0[lVar15];
      auVar55._2_2_ = asStack_940[lVar15 + 1] - asStack_8c0[lVar15 + 1];
      auVar55._4_2_ = asStack_940[lVar15 + 2] - asStack_8c0[lVar15 + 2];
      auVar55._6_2_ = asStack_940[lVar15 + 3] - asStack_8c0[lVar15 + 3];
      auVar55._8_2_ = asStack_940[lVar15 + 4] - asStack_8c0[lVar15 + 4];
      auVar55._10_2_ = asStack_940[lVar15 + 5] - asStack_8c0[lVar15 + 5];
      auVar55._12_2_ = asStack_940[lVar15 + 6] - asStack_8c0[lVar15 + 6];
      auVar55._14_2_ = asStack_940[lVar15 + 7] - asStack_8c0[lVar15 + 7];
      auVar96 = psraw(auVar96,1);
      auVar24 = psraw(auVar24,1);
      auVar37 = psraw(auVar37,1);
      auVar55 = psraw(auVar55,1);
      psVar17 = (short *)(puVar14 + lVar15 * 2);
      *psVar17 = auVar37._0_2_ + auVar96._0_2_;
      psVar17[1] = auVar37._2_2_ + auVar96._2_2_;
      psVar17[2] = auVar37._4_2_ + auVar96._4_2_;
      psVar17[3] = auVar37._6_2_ + auVar96._6_2_;
      psVar17[4] = auVar37._8_2_ + auVar96._8_2_;
      psVar17[5] = auVar37._10_2_ + auVar96._10_2_;
      psVar17[6] = auVar37._12_2_ + auVar96._12_2_;
      psVar17[7] = auVar37._14_2_ + auVar96._14_2_;
      psVar17 = (short *)(puVar14 + lVar15 * 2 + 0x80);
      *psVar17 = auVar55._0_2_ + auVar24._0_2_;
      psVar17[1] = auVar55._2_2_ + auVar24._2_2_;
      psVar17[2] = auVar55._4_2_ + auVar24._4_2_;
      psVar17[3] = auVar55._6_2_ + auVar24._6_2_;
      psVar17[4] = auVar55._8_2_ + auVar24._8_2_;
      psVar17[5] = auVar55._10_2_ + auVar24._10_2_;
      psVar17[6] = auVar55._12_2_ + auVar24._12_2_;
      psVar17[7] = auVar55._14_2_ + auVar24._14_2_;
      psVar17 = (short *)(puVar14 + lVar15 * 2 + 0x100);
      *psVar17 = auVar96._0_2_ - auVar37._0_2_;
      psVar17[1] = auVar96._2_2_ - auVar37._2_2_;
      psVar17[2] = auVar96._4_2_ - auVar37._4_2_;
      psVar17[3] = auVar96._6_2_ - auVar37._6_2_;
      psVar17[4] = auVar96._8_2_ - auVar37._8_2_;
      psVar17[5] = auVar96._10_2_ - auVar37._10_2_;
      psVar17[6] = auVar96._12_2_ - auVar37._12_2_;
      psVar17[7] = auVar96._14_2_ - auVar37._14_2_;
      psVar17 = (short *)(puVar14 + lVar15 * 2 + 0x180);
      *psVar17 = auVar24._0_2_ - auVar55._0_2_;
      psVar17[1] = auVar24._2_2_ - auVar55._2_2_;
      psVar17[2] = auVar24._4_2_ - auVar55._4_2_;
      psVar17[3] = auVar24._6_2_ - auVar55._6_2_;
      psVar17[4] = auVar24._8_2_ - auVar55._8_2_;
      psVar17[5] = auVar24._10_2_ - auVar55._10_2_;
      psVar17[6] = auVar24._12_2_ - auVar55._12_2_;
      psVar17[7] = auVar24._14_2_ - auVar55._14_2_;
      uVar13 = (uint)lVar15;
      lVar15 = lVar15 + 8;
    } while (uVar13 < 0x38);
    lVar16 = lVar16 + 1;
    puVar14 = puVar14 + 0x200;
  } while (lVar16 != 4);
  lVar16 = 0;
  do {
    auVar24 = *(undefined1 (*) [16])(local_840 + lVar16 * 2);
    auVar37 = *(undefined1 (*) [16])(auStack_640 + lVar16 * 2);
    auVar55 = *(undefined1 (*) [16])(auStack_440 + lVar16 * 2);
    auVar96 = *(undefined1 (*) [16])(auStack_240 + lVar16 * 2);
    auVar38 = psraw(auVar24,0xf);
    auVar113._0_12_ = auVar24._0_12_;
    auVar113._12_2_ = auVar24._6_2_;
    auVar113._14_2_ = auVar38._6_2_;
    auVar26._12_4_ = auVar113._12_4_;
    auVar26._0_10_ = auVar24._0_10_;
    auVar26._10_2_ = auVar38._4_2_;
    auVar25._10_6_ = auVar26._10_6_;
    auVar25._0_8_ = auVar24._0_8_;
    auVar25._8_2_ = auVar24._4_2_;
    auVar9._4_8_ = auVar25._8_8_;
    auVar9._2_2_ = auVar38._2_2_;
    auVar9._0_2_ = auVar24._2_2_;
    iVar19 = CONCAT22(auVar38._0_2_,auVar24._0_2_);
    iVar93 = CONCAT22(auVar38._8_2_,auVar24._8_2_);
    auVar94._0_8_ = CONCAT26(auVar38._10_2_,CONCAT24(auVar24._10_2_,iVar93));
    auVar94._8_2_ = auVar24._12_2_;
    auVar94._10_2_ = auVar38._12_2_;
    auVar97._12_2_ = auVar24._14_2_;
    auVar97._0_12_ = auVar94;
    auVar97._14_2_ = auVar38._14_2_;
    auVar24 = psraw(auVar37,0xf);
    auVar142._0_12_ = auVar37._0_12_;
    auVar142._12_2_ = auVar37._6_2_;
    auVar142._14_2_ = auVar24._6_2_;
    auVar141._12_4_ = auVar142._12_4_;
    auVar141._0_10_ = auVar37._0_10_;
    auVar141._10_2_ = auVar24._4_2_;
    auVar140._10_6_ = auVar141._10_6_;
    auVar140._0_8_ = auVar37._0_8_;
    auVar140._8_2_ = auVar37._4_2_;
    auVar10._4_8_ = auVar140._8_8_;
    auVar10._2_2_ = auVar24._2_2_;
    auVar10._0_2_ = auVar37._2_2_;
    iVar139 = CONCAT22(auVar24._0_2_,auVar37._0_2_);
    iVar109 = CONCAT22(auVar24._8_2_,auVar37._8_2_);
    auVar110._0_8_ = CONCAT26(auVar24._10_2_,CONCAT24(auVar37._10_2_,iVar109));
    auVar110._8_2_ = auVar37._12_2_;
    auVar110._10_2_ = auVar24._12_2_;
    auVar111._12_2_ = auVar37._14_2_;
    auVar111._0_12_ = auVar110;
    auVar111._14_2_ = auVar24._14_2_;
    auVar24 = psraw(auVar55,0xf);
    auVar41._0_12_ = auVar55._0_12_;
    auVar41._12_2_ = auVar55._6_2_;
    auVar41._14_2_ = auVar24._6_2_;
    auVar40._12_4_ = auVar41._12_4_;
    auVar40._0_10_ = auVar55._0_10_;
    auVar40._10_2_ = auVar24._4_2_;
    auVar39._10_6_ = auVar40._10_6_;
    auVar39._0_8_ = auVar55._0_8_;
    auVar39._8_2_ = auVar55._4_2_;
    auVar11._4_8_ = auVar39._8_8_;
    auVar11._2_2_ = auVar24._2_2_;
    auVar11._0_2_ = auVar55._2_2_;
    iVar36 = CONCAT22(auVar24._0_2_,auVar55._0_2_);
    iVar72 = CONCAT22(auVar24._8_2_,auVar55._8_2_);
    auVar73._0_8_ = CONCAT26(auVar24._10_2_,CONCAT24(auVar55._10_2_,iVar72));
    auVar73._8_2_ = auVar55._12_2_;
    auVar73._10_2_ = auVar24._12_2_;
    auVar75._12_2_ = auVar55._14_2_;
    auVar75._0_12_ = auVar73;
    auVar75._14_2_ = auVar24._14_2_;
    auVar24 = psraw(auVar96,0xf);
    auVar162._0_12_ = auVar96._0_12_;
    auVar162._12_2_ = auVar96._6_2_;
    auVar162._14_2_ = auVar24._6_2_;
    auVar161._12_4_ = auVar162._12_4_;
    auVar161._0_10_ = auVar96._0_10_;
    auVar161._10_2_ = auVar24._4_2_;
    auVar160._10_6_ = auVar161._10_6_;
    auVar160._0_8_ = auVar96._0_8_;
    auVar160._8_2_ = auVar96._4_2_;
    auVar12._4_8_ = auVar160._8_8_;
    auVar12._2_2_ = auVar24._2_2_;
    auVar12._0_2_ = auVar96._2_2_;
    iVar159 = CONCAT22(auVar24._0_2_,auVar96._0_2_);
    iVar122 = CONCAT22(auVar24._8_2_,auVar96._8_2_);
    auVar123._0_8_ = CONCAT26(auVar24._10_2_,CONCAT24(auVar96._10_2_,iVar122));
    auVar123._8_2_ = auVar96._12_2_;
    auVar123._10_2_ = auVar24._12_2_;
    auVar124._12_2_ = auVar96._14_2_;
    auVar124._0_12_ = auVar123;
    auVar124._14_2_ = auVar24._14_2_;
    iVar102 = (int)((ulong)auVar94._0_8_ >> 0x20);
    iVar172 = (int)((ulong)auVar110._0_8_ >> 0x20);
    iVar86 = (int)((ulong)auVar73._0_8_ >> 0x20);
    iVar152 = (int)((ulong)auVar123._0_8_ >> 0x20);
    auVar56._0_4_ = iVar139 + iVar19 >> 2;
    auVar56._4_4_ = auVar10._0_4_ + auVar9._0_4_ >> 2;
    auVar56._8_4_ = auVar140._8_4_ + auVar25._8_4_ >> 2;
    auVar56._12_4_ = auVar141._12_4_ + auVar26._12_4_ >> 2;
    auVar38._0_4_ = iVar19 - iVar139 >> 2;
    auVar38._4_4_ = auVar9._0_4_ - auVar10._0_4_ >> 2;
    auVar38._8_4_ = auVar25._8_4_ - auVar140._8_4_ >> 2;
    auVar38._12_4_ = auVar26._12_4_ - auVar141._12_4_ >> 2;
    auVar112._0_4_ = iVar159 + iVar36 >> 2;
    auVar112._4_4_ = auVar12._0_4_ + auVar11._0_4_ >> 2;
    auVar112._8_4_ = auVar160._8_4_ + auVar39._8_4_ >> 2;
    auVar112._12_4_ = auVar161._12_4_ + auVar40._12_4_ >> 2;
    auVar42._0_4_ = iVar36 - iVar159 >> 2;
    auVar42._4_4_ = auVar11._0_4_ - auVar12._0_4_ >> 2;
    auVar42._8_4_ = auVar39._8_4_ - auVar160._8_4_ >> 2;
    auVar42._12_4_ = auVar40._12_4_ - auVar161._12_4_ >> 2;
    auVar171._0_4_ = iVar109 + iVar93 >> 2;
    auVar171._4_4_ = iVar172 + iVar102 >> 2;
    auVar171._8_4_ = auVar110._8_4_ + auVar94._8_4_ >> 2;
    auVar171._12_4_ = auVar111._12_4_ + auVar97._12_4_ >> 2;
    auVar55 = packssdw(auVar56,auVar171);
    auVar98._0_4_ = iVar93 - iVar109 >> 2;
    auVar98._4_4_ = iVar102 - iVar172 >> 2;
    auVar98._8_4_ = auVar94._8_4_ - auVar110._8_4_ >> 2;
    auVar98._12_4_ = auVar97._12_4_ - auVar111._12_4_ >> 2;
    auVar24 = packssdw(auVar38,auVar98);
    auVar143._0_4_ = iVar122 + iVar72 >> 2;
    auVar143._4_4_ = iVar152 + iVar86 >> 2;
    auVar143._8_4_ = auVar123._8_4_ + auVar73._8_4_ >> 2;
    auVar143._12_4_ = auVar124._12_4_ + auVar75._12_4_ >> 2;
    auVar113 = packssdw(auVar112,auVar143);
    auVar76._0_4_ = iVar72 - iVar122 >> 2;
    auVar76._4_4_ = iVar86 - iVar152 >> 2;
    auVar76._8_4_ = auVar73._8_4_ - auVar123._8_4_ >> 2;
    auVar76._12_4_ = auVar75._12_4_ - auVar124._12_4_ >> 2;
    auVar37 = packssdw(auVar42,auVar76);
    sVar18 = auVar113._0_2_ + auVar55._0_2_;
    sVar28 = auVar113._2_2_ + auVar55._2_2_;
    uVar20 = CONCAT22(sVar28,sVar18);
    sVar29 = auVar113._4_2_ + auVar55._4_2_;
    uVar21 = CONCAT24(sVar29,uVar20);
    sVar30 = auVar113._6_2_ + auVar55._6_2_;
    uVar22 = CONCAT26(sVar30,uVar21);
    sVar31 = auVar113._8_2_ + auVar55._8_2_;
    auVar74._0_10_ = CONCAT28(sVar31,uVar22);
    auVar74._10_2_ = auVar113._10_2_ + auVar55._10_2_;
    auVar77._12_2_ = auVar113._12_2_ + auVar55._12_2_;
    auVar77._0_12_ = auVar74;
    auVar77._14_2_ = auVar113._14_2_ + auVar55._14_2_;
    sVar32 = auVar37._0_2_ + auVar24._0_2_;
    sVar33 = auVar37._2_2_ + auVar24._2_2_;
    uVar51 = CONCAT22(sVar33,sVar32);
    sVar34 = auVar37._4_2_ + auVar24._4_2_;
    uVar52 = CONCAT24(sVar34,uVar51);
    sVar43 = auVar37._6_2_ + auVar24._6_2_;
    uVar53 = CONCAT26(sVar43,uVar52);
    sVar92 = auVar37._8_2_ + auVar24._8_2_;
    auVar95._0_10_ = CONCAT28(sVar92,uVar53);
    auVar95._10_2_ = auVar37._10_2_ + auVar24._10_2_;
    auVar99._12_2_ = auVar37._12_2_ + auVar24._12_2_;
    auVar99._0_12_ = auVar95;
    auVar99._14_2_ = auVar37._14_2_ + auVar24._14_2_;
    auVar96 = psraw(auVar77,0xf);
    auVar149._12_2_ = sVar30;
    auVar149._0_12_ = auVar74;
    auVar149._14_2_ = auVar96._6_2_;
    auVar148._12_4_ = auVar149._12_4_;
    auVar148._10_2_ = auVar96._4_2_;
    auVar148._0_10_ = auVar74._0_10_;
    auVar147._10_6_ = auVar148._10_6_;
    auVar147._8_2_ = sVar29;
    auVar147._0_8_ = uVar22;
    auVar146._8_8_ = auVar147._8_8_;
    auVar146._6_2_ = auVar96._2_2_;
    auVar146._0_6_ = uVar21;
    auVar145._6_10_ = auVar146._6_10_;
    auVar145._4_2_ = sVar28;
    auVar145._0_4_ = uVar20;
    auVar144._4_12_ = auVar145._4_12_;
    auVar144._2_2_ = auVar96._0_2_;
    auVar144._0_2_ = sVar18;
    *(undefined1 (*) [16])coeff = auVar144;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0x20) = sVar31;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 2) = auVar96._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 4) = auVar74._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 6) = auVar96._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 8) = auVar77._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 10) = auVar96._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 0xc) = auVar77._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 0xe) = auVar96._14_2_;
    auVar96 = psraw(auVar99,0xf);
    auVar130._12_2_ = sVar43;
    auVar130._0_12_ = auVar95;
    auVar130._14_2_ = auVar96._6_2_;
    auVar129._12_4_ = auVar130._12_4_;
    auVar129._10_2_ = auVar96._4_2_;
    auVar129._0_10_ = auVar95._0_10_;
    auVar128._10_6_ = auVar129._10_6_;
    auVar128._8_2_ = sVar34;
    auVar128._0_8_ = uVar53;
    auVar127._8_8_ = auVar128._8_8_;
    auVar127._6_2_ = auVar96._2_2_;
    auVar127._0_6_ = uVar52;
    auVar126._6_10_ = auVar127._6_10_;
    auVar126._4_2_ = sVar33;
    auVar126._0_4_ = uVar51;
    auVar125._4_12_ = auVar126._4_12_;
    auVar125._2_2_ = auVar96._0_2_;
    auVar125._0_2_ = sVar32;
    *(undefined1 (*) [16])((long)coeff + 0x400) = auVar125;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0x420) = sVar92;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 2) = auVar96._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 4) = auVar95._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 6) = auVar96._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 8) = auVar99._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 10) = auVar96._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 0xc) = auVar99._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 0xe) = auVar96._14_2_;
    sVar32 = auVar55._0_2_ - auVar113._0_2_;
    sVar33 = auVar55._2_2_ - auVar113._2_2_;
    uVar51 = CONCAT22(sVar33,sVar32);
    sVar34 = auVar55._4_2_ - auVar113._4_2_;
    uVar52 = CONCAT24(sVar34,uVar51);
    sVar43 = auVar55._6_2_ - auVar113._6_2_;
    uVar53 = CONCAT26(sVar43,uVar52);
    sVar92 = auVar55._8_2_ - auVar113._8_2_;
    auVar54._0_10_ = CONCAT28(sVar92,uVar53);
    auVar54._10_2_ = auVar55._10_2_ - auVar113._10_2_;
    auVar57._12_2_ = auVar55._12_2_ - auVar113._12_2_;
    auVar57._0_12_ = auVar54;
    auVar57._14_2_ = auVar55._14_2_ - auVar113._14_2_;
    sVar18 = auVar24._0_2_ - auVar37._0_2_;
    sVar28 = auVar24._2_2_ - auVar37._2_2_;
    uVar20 = CONCAT22(sVar28,sVar18);
    sVar29 = auVar24._4_2_ - auVar37._4_2_;
    uVar21 = CONCAT24(sVar29,uVar20);
    sVar30 = auVar24._6_2_ - auVar37._6_2_;
    uVar22 = CONCAT26(sVar30,uVar21);
    sVar31 = auVar24._8_2_ - auVar37._8_2_;
    auVar23._0_10_ = CONCAT28(sVar31,uVar22);
    auVar23._10_2_ = auVar24._10_2_ - auVar37._10_2_;
    auVar27._12_2_ = auVar24._12_2_ - auVar37._12_2_;
    auVar27._0_12_ = auVar23;
    auVar27._14_2_ = auVar24._14_2_ - auVar37._14_2_;
    auVar24 = psraw(auVar57,0xf);
    auVar83._12_2_ = sVar43;
    auVar83._0_12_ = auVar54;
    auVar83._14_2_ = auVar24._6_2_;
    auVar82._12_4_ = auVar83._12_4_;
    auVar82._10_2_ = auVar24._4_2_;
    auVar82._0_10_ = auVar54._0_10_;
    auVar81._10_6_ = auVar82._10_6_;
    auVar81._8_2_ = sVar34;
    auVar81._0_8_ = uVar53;
    auVar80._8_8_ = auVar81._8_8_;
    auVar80._6_2_ = auVar24._2_2_;
    auVar80._0_6_ = uVar52;
    auVar79._6_10_ = auVar80._6_10_;
    auVar79._4_2_ = sVar33;
    auVar79._0_4_ = uVar51;
    auVar78._4_12_ = auVar79._4_12_;
    auVar78._2_2_ = auVar24._0_2_;
    auVar78._0_2_ = sVar32;
    *(undefined1 (*) [16])((long)coeff + 0x800) = auVar78;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0x820) = sVar92;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 2) = auVar24._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 4) = auVar54._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 6) = auVar24._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 8) = auVar57._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 10) = auVar24._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 0xc) = auVar57._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 0xe) = auVar24._14_2_;
    auVar24 = psraw(auVar27,0xf);
    auVar63._12_2_ = sVar30;
    auVar63._0_12_ = auVar23;
    auVar63._14_2_ = auVar24._6_2_;
    auVar62._12_4_ = auVar63._12_4_;
    auVar62._10_2_ = auVar24._4_2_;
    auVar62._0_10_ = auVar23._0_10_;
    auVar61._10_6_ = auVar62._10_6_;
    auVar61._8_2_ = sVar29;
    auVar61._0_8_ = uVar22;
    auVar60._8_8_ = auVar61._8_8_;
    auVar60._6_2_ = auVar24._2_2_;
    auVar60._0_6_ = uVar21;
    auVar59._6_10_ = auVar60._6_10_;
    auVar59._4_2_ = sVar28;
    auVar59._0_4_ = uVar20;
    auVar58._4_12_ = auVar59._4_12_;
    auVar58._2_2_ = auVar24._0_2_;
    auVar58._0_2_ = sVar18;
    *(undefined1 (*) [16])((long)coeff + 0xc00) = auVar58;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0xc20) = sVar31;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 2) = auVar24._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 4) = auVar23._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 6) = auVar24._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 8) = auVar27._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 10) = auVar24._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 0xc) = auVar27._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 0xe) = auVar24._14_2_;
    uVar13 = (uint)lVar16;
    coeff = (tran_low_t *)
            ((long)*(undefined1 (*) [16])((long)coeff + 0x10) + (ulong)(uVar13 & 8) * 4);
    lVar16 = lVar16 + 8;
  } while (uVar13 < 0xf8);
  return;
}

Assistant:

void aom_hadamard_32x32_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                             tran_low_t *coeff) {
  // For high bitdepths, it is unnecessary to store_tran_low
  // (mult/unpack/store), then load_tran_low (load/pack) the same memory in the
  // next stage.  Output to an intermediate buffer first, then store_tran_low()
  // in the final stage.
  DECLARE_ALIGNED(32, int16_t, temp_coeff[32 * 32]);
  int16_t *t_coeff = temp_coeff;
  int idx;
  __m128i coeff0_lo, coeff1_lo, coeff2_lo, coeff3_lo, b0_lo, b1_lo, b2_lo,
      b3_lo;
  __m128i coeff0_hi, coeff1_hi, coeff2_hi, coeff3_hi, b0_hi, b1_hi, b2_hi,
      b3_hi;
  __m128i b0, b1, b2, b3;
  const __m128i zero = _mm_setzero_si128();
  for (idx = 0; idx < 4; ++idx) {
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 16 * src_stride + (idx & 0x01) * 16;
    hadamard_16x16_sse2(src_ptr, src_stride,
                        (tran_low_t *)(t_coeff + idx * 256), 0);
  }

  for (idx = 0; idx < 256; idx += 8) {
    __m128i coeff0 = _mm_load_si128((const __m128i *)t_coeff);
    __m128i coeff1 = _mm_load_si128((const __m128i *)(t_coeff + 256));
    __m128i coeff2 = _mm_load_si128((const __m128i *)(t_coeff + 512));
    __m128i coeff3 = _mm_load_si128((const __m128i *)(t_coeff + 768));

    // Sign extend 16 bit to 32 bit.
    sign_extend_16bit_to_32bit_sse2(coeff0, zero, &coeff0_lo, &coeff0_hi);
    sign_extend_16bit_to_32bit_sse2(coeff1, zero, &coeff1_lo, &coeff1_hi);
    sign_extend_16bit_to_32bit_sse2(coeff2, zero, &coeff2_lo, &coeff2_hi);
    sign_extend_16bit_to_32bit_sse2(coeff3, zero, &coeff3_lo, &coeff3_hi);

    b0_lo = _mm_add_epi32(coeff0_lo, coeff1_lo);
    b0_hi = _mm_add_epi32(coeff0_hi, coeff1_hi);

    b1_lo = _mm_sub_epi32(coeff0_lo, coeff1_lo);
    b1_hi = _mm_sub_epi32(coeff0_hi, coeff1_hi);

    b2_lo = _mm_add_epi32(coeff2_lo, coeff3_lo);
    b2_hi = _mm_add_epi32(coeff2_hi, coeff3_hi);

    b3_lo = _mm_sub_epi32(coeff2_lo, coeff3_lo);
    b3_hi = _mm_sub_epi32(coeff2_hi, coeff3_hi);

    b0_lo = _mm_srai_epi32(b0_lo, 2);
    b1_lo = _mm_srai_epi32(b1_lo, 2);
    b2_lo = _mm_srai_epi32(b2_lo, 2);
    b3_lo = _mm_srai_epi32(b3_lo, 2);

    b0_hi = _mm_srai_epi32(b0_hi, 2);
    b1_hi = _mm_srai_epi32(b1_hi, 2);
    b2_hi = _mm_srai_epi32(b2_hi, 2);
    b3_hi = _mm_srai_epi32(b3_hi, 2);

    b0 = _mm_packs_epi32(b0_lo, b0_hi);
    b1 = _mm_packs_epi32(b1_lo, b1_hi);
    b2 = _mm_packs_epi32(b2_lo, b2_hi);
    b3 = _mm_packs_epi32(b3_lo, b3_hi);

    coeff0 = _mm_add_epi16(b0, b2);
    coeff1 = _mm_add_epi16(b1, b3);
    store_tran_low_offset_4(coeff0, coeff);
    store_tran_low_offset_4(coeff1, coeff + 256);

    coeff2 = _mm_sub_epi16(b0, b2);
    coeff3 = _mm_sub_epi16(b1, b3);
    store_tran_low_offset_4(coeff2, coeff + 512);
    store_tran_low_offset_4(coeff3, coeff + 768);

    // Increment the pointer by 4 and 12 in alternate iterations(instead of 8)
    // to ensure the coherency with the implementation of
    // store_tran_low_offset_4()
    coeff += (4 + (((idx >> 3) & 1) << 3));
    t_coeff += 8;
  }
}